

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

QStringList * __thiscall QRegularExpression::namedCaptureGroups(QRegularExpression *this)

{
  bool bVar1;
  QRegularExpressionPrivate *pQVar2;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  int index;
  char16_t *currentNamedCapturingTableRow;
  uint i;
  QStringList *result;
  uint namedCapturingTableEntrySize;
  uint namedCapturingTableEntryCount;
  PCRE2_SPTR16 *namedCapturingTable;
  QString *in_stack_ffffffffffffff48;
  QStringView *in_stack_ffffffffffffff50;
  reference in_stack_ffffffffffffff58;
  QList<QString> *in_stack_ffffffffffffff60;
  uint local_60;
  QStringView local_40 [2];
  undefined4 local_18;
  uint local_14;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isValid((QRegularExpression *)in_stack_ffffffffffffff50);
  if (bVar1) {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_14 = 0xaaaaaaaa;
    local_18 = 0xaaaaaaaa;
    pQVar2 = QExplicitlySharedDataPointer<QRegularExpressionPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x72da88);
    pcre2_pattern_info_16(pQVar2->compiledPattern,0x13,&local_10);
    pQVar2 = QExplicitlySharedDataPointer<QRegularExpressionPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x72daa8);
    pcre2_pattern_info_16(pQVar2->compiledPattern,0x11,&local_14);
    pQVar2 = QExplicitlySharedDataPointer<QRegularExpressionPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x72dac8);
    pcre2_pattern_info_16(pQVar2->compiledPattern,0x12,&local_18);
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QExplicitlySharedDataPointer<QRegularExpressionPrivate>::operator->
              ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x72db12);
    QList<QString>::QList(in_stack_ffffffffffffff60,(qsizetype)in_stack_ffffffffffffff58);
    for (local_60 = 0; local_60 < local_14; local_60 = local_60 + 1) {
      QStringView::QStringView<const_char16_t_*,_true>
                (local_40,(char16_t **)in_stack_ffffffffffffff58);
      QStringView::toString(in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff58 =
           QList<QString>::operator[]
                     ((QList<QString> *)in_stack_ffffffffffffff50,
                      (qsizetype)in_stack_ffffffffffffff48);
      QString::operator=((QString *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      QString::~QString((QString *)0x72dbd4);
    }
  }
  else {
    memset(in_RDI,0,0x18);
    QList<QString>::QList((QList<QString> *)0x72da51);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QRegularExpression::namedCaptureGroups() const
{
    if (!isValid()) // isValid() will compile the pattern
        return QStringList();

    // namedCapturingTable will point to a table of
    // namedCapturingTableEntryCount entries, each one of which
    // contains one ushort followed by the name, NUL terminated.
    // The ushort is the numerical index of the name in the pattern.
    // The length of each entry is namedCapturingTableEntrySize.
    PCRE2_SPTR16 *namedCapturingTable;
    unsigned int namedCapturingTableEntryCount;
    unsigned int namedCapturingTableEntrySize;

    pcre2_pattern_info_16(d->compiledPattern, PCRE2_INFO_NAMETABLE, &namedCapturingTable);
    pcre2_pattern_info_16(d->compiledPattern, PCRE2_INFO_NAMECOUNT, &namedCapturingTableEntryCount);
    pcre2_pattern_info_16(d->compiledPattern, PCRE2_INFO_NAMEENTRYSIZE, &namedCapturingTableEntrySize);

    // The +1 is for the implicit group #0
    QStringList result(d->capturingCount + 1);

    for (unsigned int i = 0; i < namedCapturingTableEntryCount; ++i) {
        const auto currentNamedCapturingTableRow =
                reinterpret_cast<const char16_t *>(namedCapturingTable) + namedCapturingTableEntrySize * i;

        const int index = *currentNamedCapturingTableRow;
        result[index] = QStringView(currentNamedCapturingTableRow + 1).toString();
    }

    return result;
}